

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int trex_element(TRex *exp)

{
  char *pcVar1;
  byte bVar2;
  byte *pbVar3;
  TRexNode *pTVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ushort **ppuVar11;
  char cVar12;
  TRexNodeType TVar13;
  char *pcVar14;
  int c;
  int iVar15;
  
  pcVar14 = exp->_p;
  cVar12 = *pcVar14;
  if (cVar12 == '$') {
    exp->_p = pcVar14 + 1;
    TVar13 = 0x10a;
LAB_00109a19:
    iVar5 = trex_newnode(exp,TVar13);
  }
  else if (cVar12 == '[') {
    exp->_p = pcVar14 + 1;
    if (pcVar14[1] == '^') {
      iVar5 = trex_newnode(exp,0x107);
      pcVar14 = exp->_p + 1;
      exp->_p = pcVar14;
    }
    else {
      iVar5 = trex_newnode(exp,0x105);
      pcVar14 = exp->_p;
    }
    cVar12 = *pcVar14;
    if (cVar12 == ']') {
      pcVar14 = "empty class";
      goto LAB_00109d43;
    }
    iVar6 = iVar5;
    iVar15 = -1;
    while ((cVar12 != ']' && (pcVar14 != exp->_eol))) {
      if (iVar15 == -1 || cVar12 != '-') {
        if (iVar15 == -1) {
          iVar8 = trex_charnode(exp,1);
        }
        else {
          exp->_nodes[iVar6].next = iVar15;
          iVar8 = trex_charnode(exp,1);
          iVar6 = iVar15;
        }
      }
      else {
        exp->_p = pcVar14 + 1;
        if (*pcVar14 == ']') {
          pcVar14 = "unfinished range";
          goto LAB_00109d43;
        }
        iVar7 = trex_newnode(exp,0x108);
        pcVar14 = exp->_p;
        if (*pcVar14 < iVar15) {
          pcVar14 = "invalid range";
          goto LAB_00109d43;
        }
        pTVar4 = exp->_nodes;
        if (pTVar4[iVar15].type == 0x106) {
          pcVar14 = "cannot use character classes in ranges";
LAB_00109d52:
          trex_error(exp,pcVar14);
        }
        pTVar4[iVar7].left = pTVar4[iVar15].type;
        cVar12 = *pcVar14;
        if ((long)cVar12 == 0x5c) {
          pcVar1 = pcVar14 + 1;
          exp->_p = pcVar1;
          uVar9 = (int)pcVar14[1] - 0x66U >> 1;
          uVar10 = uVar9 | (uint)(((int)pcVar14[1] - 0x66U & 1) != 0) << 0x1f;
          exp->_p = pcVar14 + 2;
          pcVar14 = pcVar1;
          if ((uVar10 < 9) && ((0x1d1U >> (uVar9 & 0x1f) & 1) != 0)) {
            pcVar14 = &DAT_0010c488 + uVar10;
          }
        }
        else {
          ppuVar11 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar11 + (long)cVar12 * 2 + 1) & 0x40) == 0) {
            pcVar14 = "letter expected";
            goto LAB_00109d52;
          }
          exp->_p = pcVar14 + 1;
        }
        pTVar4[iVar7].right = (int)*pcVar14;
        pTVar4[iVar6].next = iVar7;
        iVar8 = -1;
        iVar6 = iVar7;
      }
      pcVar14 = exp->_p;
      cVar12 = *pcVar14;
      iVar15 = iVar8;
    }
    pTVar4 = exp->_nodes;
    if (iVar15 != -1) {
      pTVar4[iVar6].next = iVar15;
    }
    pTVar4[iVar5].left = pTVar4[iVar5].next;
    pTVar4[iVar5].next = -1;
    iVar6 = 0x5d;
LAB_00109bd0:
    trex_expect(exp,iVar6);
  }
  else {
    if (cVar12 == '.') {
      exp->_p = pcVar14 + 1;
      TVar13 = 0x104;
      goto LAB_00109a19;
    }
    if (cVar12 == '(') {
      exp->_p = pcVar14 + 1;
      TVar13 = 0x102;
      if (pcVar14[1] == '?') {
        exp->_p = pcVar14 + 2;
        trex_expect(exp,0x3a);
        TVar13 = 0x103;
      }
      iVar5 = trex_newnode(exp,TVar13);
      iVar6 = trex_list(exp);
      exp->_nodes[iVar5].left = iVar6;
      iVar6 = 0x29;
      goto LAB_00109bd0;
    }
    iVar5 = trex_charnode(exp,0);
  }
  pbVar3 = (byte *)exp->_p;
  bVar2 = *pbVar3;
  if (bVar2 == 0x7b) {
    exp->_p = (char *)(pbVar3 + 1);
    ppuVar11 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar11 + (long)(char)pbVar3[1] * 2 + 1) & 8) == 0) {
      pcVar14 = "number expected";
LAB_00109d43:
      trex_error(exp,pcVar14);
    }
    uVar9 = trex_parsenumber(exp);
    pcVar14 = exp->_p;
    if (*pcVar14 == ',') {
      exp->_p = pcVar14 + 1;
      uVar10 = 0xffff;
      if ((*(byte *)((long)*ppuVar11 + (long)pcVar14[1] * 2 + 1) & 8) != 0) {
        uVar10 = trex_parsenumber(exp);
      }
      trex_expect(exp,0x7d);
    }
    else {
      if (*pcVar14 != '}') {
        pcVar14 = ", or } expected";
        goto LAB_00109d43;
      }
      exp->_p = pcVar14 + 1;
      uVar10 = uVar9;
    }
    uVar9 = uVar9 << 0x10;
    uVar10 = uVar10 & 0xffff;
  }
  else if (bVar2 == 0x2b) {
    exp->_p = (char *)(pbVar3 + 1);
    uVar10 = 0xffff;
    uVar9 = 0x10000;
  }
  else {
    if (bVar2 == 0x3f) {
      uVar10 = 1;
      exp->_p = (char *)(pbVar3 + 1);
    }
    else {
      iVar6 = iVar5;
      if (bVar2 != 0x2a) goto LAB_00109ce6;
      exp->_p = (char *)(pbVar3 + 1);
      uVar10 = 0xffff;
    }
    uVar9 = 0;
  }
  iVar6 = trex_newnode(exp,0x100);
  pTVar4 = exp->_nodes;
  pTVar4[iVar6].left = iVar5;
  pTVar4[iVar6].right = uVar9 | uVar10;
  bVar2 = *exp->_p;
LAB_00109ce6:
  if (((0x2b < bVar2) || ((0xe0000000001U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) && (bVar2 != 0x7c)) {
    iVar5 = trex_element(exp);
    exp->_nodes[iVar6].next = iVar5;
  }
  return iVar6;
}

Assistant:

static int trex_element(TRex* exp) {
    int ret = -1;
    switch (*exp->_p) {
        case '(': {
            int expr, newn;
            exp->_p++;

            if (*exp->_p == '?') {
                exp->_p++;
                trex_expect(exp, ':');
                expr = trex_newnode(exp, OP_NOCAPEXPR);
            } else
                expr = trex_newnode(exp, OP_EXPR);
            newn = trex_list(exp);
            exp->_nodes[expr].left = newn;
            ret = expr;
            trex_expect(exp, ')');
        } break;
        case '[':
            exp->_p++;
            ret = trex_class(exp);
            trex_expect(exp, ']');
            break;
        case TREX_SYMBOL_END_OF_STRING:
            exp->_p++;
            ret = trex_newnode(exp, OP_EOL);
            break;
        case TREX_SYMBOL_ANY_CHAR:
            exp->_p++;
            ret = trex_newnode(exp, OP_DOT);
            break;
        default:
            ret = trex_charnode(exp, TRex_False);
            break;
    }

    {
        TRexBool isgreedy = TRex_False;
        unsigned short p0 = 0, p1 = 0;
        switch (*exp->_p) {
            case TREX_SYMBOL_GREEDY_ZERO_OR_MORE:
                p0 = 0;
                p1 = 0xFFFF;
                exp->_p++;
                isgreedy = TRex_True;
                break;
            case TREX_SYMBOL_GREEDY_ONE_OR_MORE:
                p0 = 1;
                p1 = 0xFFFF;
                exp->_p++;
                isgreedy = TRex_True;
                break;
            case TREX_SYMBOL_GREEDY_ZERO_OR_ONE:
                p0 = 0;
                p1 = 1;
                exp->_p++;
                isgreedy = TRex_True;
                break;
            case '{':
                exp->_p++;
                if (!isdigit((int)(*exp->_p)))
                    trex_error(exp, _SC("number expected"));
                p0 = (unsigned short)trex_parsenumber(exp);
                /*******************************/
                switch (*exp->_p) {
                    case '}':
                        p1 = p0;
                        exp->_p++;
                        break;
                    case ',':
                        exp->_p++;
                        p1 = 0xFFFF;
                        if (isdigit((int)(*exp->_p))) {
                            p1 = (unsigned short)trex_parsenumber(exp);
                        }
                        trex_expect(exp, '}');
                        break;
                    default:
                        trex_error(exp, _SC(", or } expected"));
                }
                /*******************************/
                isgreedy = TRex_True;
                break;
        }
        if (isgreedy) {
            int nnode = trex_newnode(exp, OP_GREEDY);
            exp->_nodes[nnode].left = ret;
            exp->_nodes[nnode].right = ((p0) << 16) | p1;
            ret = nnode;
        }
    }
    if ((*exp->_p != TREX_SYMBOL_BRANCH) && (*exp->_p != ')') && (*exp->_p != TREX_SYMBOL_GREEDY_ZERO_OR_MORE) &&
        (*exp->_p != TREX_SYMBOL_GREEDY_ONE_OR_MORE) && (*exp->_p != '\0')) {
        int nnode = trex_element(exp);
        exp->_nodes[ret].next = nnode;
    }

    return ret;
}